

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O3

void forth_drive(Forth *ptr)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  runtime_error *this;
  ForthStack<unsigned_int> *this_00;
  long lVar4;
  
  iVar1 = ForthToInt(ptr);
  if (1 < (ptr->dStack).top) {
    this_00 = &ptr->dStack;
    uVar2 = cppforth::Forth::ForthStack<unsigned_int>::getTop(this_00,0);
    uVar3 = cppforth::Forth::ForthStack<unsigned_int>::getTop(this_00,1);
    lVar4 = -2;
    do {
      cppforth::Forth::ForthStack<unsigned_int>::pop(this_00);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
    c_drive((long)iVar1,(ulong)uVar3,(ulong)uVar2);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"forth_drive does not have parameters in Forth stack");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void forth_drive(cppforth::Forth* ptr){
	int num = ForthToInt(ptr);
	if (ptr->forth_depth()>=2){
		auto speed = ptr->forth_tocell(0); 
		auto degree = ptr->forth_tocell(1); ptr->forth_pop(2);
		c_drive(num, degree, speed);
	}
	else {
		throw std::runtime_error(("forth_drive does not have parameters in Forth stack"));
	}
}